

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcDispatch.cpp
# Opt level: O3

void __thiscall XmlRpc::XmlRpcDispatch::work(XmlRpcDispatch *this,double timeout)

{
  size_t *psVar1;
  ushort uVar2;
  long *plVar3;
  _List_node_base *p_Var4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  XmlRpcDispatch *pXVar9;
  int *piVar10;
  int __timeout;
  long lVar11;
  int iVar12;
  ulong uVar13;
  _Node_conflict1 *__tmp;
  ulong __n;
  _List_node_base *p_Var14;
  double dVar15;
  uint32_t nsec_1;
  uint32_t nsec;
  uint32_t sec;
  SourceList closeList;
  uint local_7c;
  uint local_78;
  undefined4 uStack_74;
  long local_68;
  vector<pollfd,_std::allocator<pollfd>_> local_60;
  _List_node_base local_48;
  
  if (0.0 <= timeout) {
    miniros::clock::steadytime((uint32_t *)&local_60,&local_78);
    dVar15 = (double)local_78 / 1000000000.0 +
             (double)(uint)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                           super__Vector_impl_data._M_start + timeout;
  }
  else {
    dVar15 = -1.0;
  }
  this->_endTime = dVar15;
  this->_doClear = false;
  this->_inWork = true;
  dVar15 = floor(timeout * 1000.0);
  __timeout = -1;
  if (-1 < (int)dVar15) {
    __timeout = (int)dVar15;
  }
  do {
    if ((XmlRpcDispatch *)
        (this->_sources).
        super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ._M_impl._M_node.super__List_node_base._M_next == this) goto LAB_00249e45;
    __n = (ulong)(uint)(this->_sources).
                       super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                       ._M_impl._M_node._M_size;
    std::vector<pollfd,_std::allocator<pollfd>_>::vector(&local_60,__n,(allocator_type *)&local_78);
    std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::vector
              ((vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> *)&local_78,
               __n,(allocator_type *)&local_48);
    pXVar9 = (XmlRpcDispatch *)
             (this->_sources).
             super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pXVar9 != this) {
      lVar11 = 0;
      do {
        *(size_t *)(CONCAT44(uStack_74,local_78) + lVar11) =
             (pXVar9->_sources).
             super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ._M_impl._M_node._M_size;
        lVar6 = CONCAT44(local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (uint)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                               super__Vector_impl_data._M_start);
        *(undefined4 *)(lVar6 + lVar11) =
             *(undefined4 *)(*(long *)(CONCAT44(uStack_74,local_78) + lVar11) + 8);
        *(undefined4 *)(lVar6 + 4 + lVar11) = 0;
        uVar2 = *(ushort *)&pXVar9->_endTime;
        *(ushort *)(lVar6 + 4 + lVar11) = uVar2 >> 1 & 2 | (uVar2 & 1) + (uVar2 & 2) * 2;
        pXVar9 = (XmlRpcDispatch *)
                 (pXVar9->_sources).
                 super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        lVar11 = lVar11 + 8;
      } while (pXVar9 != this);
    }
    uVar7 = poll((pollfd *)
                 CONCAT44(local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                                .super__Vector_impl_data._M_start),__n,__timeout);
    if ((int)uVar7 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).",(ulong)uVar7);
      }
      this->_inWork = false;
      iVar12 = 1;
    }
    else {
      if (__n != 0) {
        uVar13 = 0;
        do {
          plVar3 = *(long **)(CONCAT44(uStack_74,local_78) + uVar13 * 8);
          lVar11 = CONCAT44(local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          uVar2 = *(ushort *)(lVar11 + 4 + uVar13 * 8);
          uVar7 = 0xffffffff;
          if (((uVar2 & 1) != 0) && ((*(byte *)(lVar11 + 6 + uVar13 * 8) & 0x19) != 0)) {
            uVar7 = (**(code **)(*plVar3 + 0x18))(plVar3,1);
          }
          if (((uVar2 & 4) != 0) && ((*(byte *)(lVar11 + 6 + uVar13 * 8) & 0xc) != 0)) {
            uVar8 = (**(code **)(*plVar3 + 0x18))(plVar3,2);
            uVar7 = uVar7 & uVar8;
          }
          pXVar9 = this;
          if (((uVar2 & 2) != 0) && ((*(byte *)(lVar11 + 6 + uVar13 * 8) & 0x22) != 0)) {
            uVar8 = (**(code **)(*plVar3 + 0x18))(plVar3,4);
            uVar7 = uVar7 & uVar8;
          }
          do {
            pXVar9 = (XmlRpcDispatch *)
                     (pXVar9->_sources).
                     super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
            if (pXVar9 == this) {
              XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn\'t find source iterator");
              goto LAB_00249d1f;
            }
          } while ((long *)(pXVar9->_sources).
                           super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                           ._M_impl._M_node._M_size != plVar3);
          if (uVar7 != 0xffffffff) {
            if (uVar7 == 0) {
              psVar1 = &(this->_sources).
                        super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(pXVar9,0x20);
              if (*(char *)((long)plVar3 + 0xd) == '\0') {
                (**(code **)(*plVar3 + 0x10))(plVar3);
              }
            }
            else {
              *(uint *)&pXVar9->_endTime = uVar7;
            }
          }
LAB_00249d1f:
          uVar13 = uVar13 + 1;
        } while (uVar13 != __n);
      }
      if (this->_doClear == true) {
        std::__cxx11::
        list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ::list((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                *)&local_48,&this->_sources);
        std::__cxx11::
        list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ::clear(&this->_sources);
        p_Var14 = (_List_node_base *)CONCAT44(local_48._M_next._4_4_,(uint)local_48._M_next);
        if (p_Var14 != &local_48) {
          do {
            if (p_Var14[1]._M_next != (_List_node_base *)0x0) {
              (**(code **)((long)(p_Var14[1]._M_next)->_M_next + 0x10))();
            }
            p_Var14 = (((_List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                         *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          } while (p_Var14 != &local_48);
          p_Var14 = (_List_node_base *)CONCAT44(local_48._M_next._4_4_,(uint)local_48._M_next);
        }
        this->_doClear = false;
        while (p_Var14 != &local_48) {
          p_Var4 = p_Var14->_M_next;
          operator_delete(p_Var14,0x20);
          p_Var14 = p_Var4;
        }
      }
      if (0.0 <= this->_endTime) {
        miniros::clock::steadytime((uint32_t *)&local_48,&local_7c);
        dVar15 = (double)local_7c / 1000000000.0 + (double)(uint)local_48._M_next;
        iVar12 = 3;
        if (this->_endTime <= dVar15 && dVar15 != this->_endTime) goto LAB_00249e0a;
      }
      iVar12 = 0;
    }
LAB_00249e0a:
    pvVar5 = (void *)CONCAT44(uStack_74,local_78);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,local_68 - (long)pvVar5);
    }
    pvVar5 = (void *)CONCAT44(local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_60.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5)
      ;
    }
  } while (iVar12 == 0);
  if (iVar12 == 3) {
LAB_00249e45:
    this->_inWork = false;
  }
  return;
}

Assistant:

void XmlRpcDispatch::work(double timeout)
{
  // Loosely based on `man select` > Correspondence between select() and poll() notifications
  // and cloudius-systems/osv#35, cloudius-systems/osv@b53d39a using poll to emulate select
  const unsigned POLLIN_REQ = POLLIN; // Request read
  const unsigned POLLIN_CHK = (POLLIN | POLLHUP | POLLERR); // Readable or connection lost
  const unsigned POLLOUT_REQ = POLLOUT; // Request write
  const unsigned POLLOUT_CHK = (POLLOUT | POLLERR); // Writable or connection lost
#if !defined(_WIN32)
  const unsigned POLLEX_REQ = POLLPRI; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLPRI | POLLNVAL); // Out-of-band data or invalid fd
#else
  const unsigned POLLEX_REQ = POLLRDBAND; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLRDBAND | POLLNVAL); // Out-of-band data or invalid fd
#endif

  // Compute end time
  _endTime = (timeout < 0.0) ? -1.0 : (getTime() + timeout);
  _doClear = false;
  _inWork = true;
  int timeout_ms = static_cast<int>(floor(timeout * 1000.));

  // Only work while there is something to monitor
  while (!_sources.empty()) {

    // Construct the sets of descriptors we are interested in
    const unsigned source_cnt = _sources.size();
    std::vector<pollfd> fds(source_cnt);
    std::vector<XmlRpcSource *> sources(source_cnt);

    SourceList::iterator it;
    std::size_t i = 0;
    for (it=_sources.begin(); it!=_sources.end(); ++it, ++i) {
      sources[i] = it->getSource();
      fds[i].fd = sources[i]->getfd();
      fds[i].revents = 0; // some platforms may not clear this in poll()
      fds[i].events = 0;
      unsigned mask = it->getMask();
      if (mask & ReadableEvent)
        fds[i].events |= POLLIN_REQ;
      if (mask & WritableEvent)
        fds[i].events |= POLLOUT_REQ;
      if (mask & Exception)
        fds[i].events |= POLLEX_REQ;
    }

    // Check for events
    int nEvents = poll(&fds[0], source_cnt, (timeout_ms < 0) ? -1 : timeout_ms);

    if (nEvents < 0)
    {
#if defined(_WIN32)
      XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", WSAGetLastError());
#else
      if(errno != EINTR)
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", nEvents);
#endif
      _inWork = false;
      return;
    }

    // Process events
    for (i=0; i < source_cnt; ++i)
    {
      XmlRpcSource* src = sources[i];
      pollfd & pfd = fds[i];
      unsigned newMask = (unsigned) -1;
      // Only handle requested events to avoid being prematurely removed from dispatch
      bool readable = (pfd.events & POLLIN_REQ) == POLLIN_REQ;
      bool writable = (pfd.events & POLLOUT_REQ) == POLLOUT_REQ;
      bool oob = (pfd.events & POLLEX_REQ) == POLLEX_REQ;
      if (readable && (pfd.revents & POLLIN_CHK))
        newMask &= src->handleEvent(ReadableEvent);
      if (writable && (pfd.revents & POLLOUT_CHK))
        newMask &= src->handleEvent(WritableEvent);
      if (oob && (pfd.revents & POLLEX_CHK))
        newMask &= src->handleEvent(Exception);

      // Find the source iterator. It may have moved as a result of the way
      // that sources are removed and added in the call stack starting
      // from the handleEvent() calls above.
      SourceList::iterator thisIt;
      for (thisIt = _sources.begin(); thisIt != _sources.end(); thisIt++)
      {
        if(thisIt->getSource() == src)
          break;
      }
      if(thisIt == _sources.end())
      {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn't find source iterator");
        continue;
      }

      if ( ! newMask) {
        _sources.erase(thisIt);  // Stop monitoring this one
        if ( ! src->getKeepOpen())
          src->close();
      } else if (newMask != (unsigned) -1) {
        thisIt->getMask() = newMask;
      }
    }

    // Check whether to clear all sources
    if (_doClear)
    {
      SourceList closeList = _sources;
      _sources.clear();
      for (MonitoredSource& ms: closeList) {
        XmlRpcSource* src = ms.getSource();
        assert(src);
        if (src)
          src->close();
      }
      _doClear = false;
    }

    // Check whether end time has passed
    if (0 <= _endTime && getTime() > _endTime)
      break;
  }

  _inWork = false;
}